

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::
     distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,comm *comm)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __dest;
  bool bVar1;
  unsigned_long total_size;
  long lVar2;
  size_t __n;
  size_t local_size;
  signed_size_t surplus;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<long,_std::allocator<long>_> surpluses;
  unsigned_long local_90;
  long local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  if (comm->m_size == 1) {
    if ((long)end._M_current - (long)begin._M_current == 0) {
      return;
    }
    memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
    return;
  }
  __n = (long)end._M_current - (long)begin._M_current;
  local_90 = (long)__n >> 2;
  local_80._M_current = out._M_current;
  total_size = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_90,comm);
  bVar1 = any_of(local_90 == total_size,comm);
  if (bVar1) {
    impl::
    distribute_scatter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (begin,end,local_80,total_size,comm);
    return;
  }
  lVar2 = 0;
  local_88 = (local_90 - total_size / (ulong)(long)comm->m_size) -
             (ulong)((ulong)(long)comm->m_rank < total_size % (ulong)(long)comm->m_size);
  allgather<long>((vector<long,_std::allocator<long>_> *)&local_48,&local_88,comm);
  for (; local_48._M_impl.super__Vector_impl_data._M_start !=
         local_48._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + 1) {
    lVar2 = lVar2 + *local_48._M_impl.super__Vector_impl_data._M_start;
  }
  if (lVar2 != 0) {
    assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                ,0xe1,"distribute");
  }
  impl::surplus_send_pairing
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (vector<long,_std::allocator<long>_> *)&local_48,comm->m_size,comm->m_rank,false);
  __dest._M_current = local_80._M_current;
  all2all<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,comm);
  if (local_88 < 1) {
    lVar2 = 0;
    for (; local_78._M_impl.super__Vector_impl_data._M_start !=
           local_78._M_impl.super__Vector_impl_data._M_finish;
        local_78._M_impl.super__Vector_impl_data._M_start =
             local_78._M_impl.super__Vector_impl_data._M_start + 1) {
      lVar2 = lVar2 + *local_78._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar2 != 0) {
      assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0xed,"distribute");
    }
    all2allv<int>((int *)0x0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
                  __dest._M_current + local_90,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,comm);
    if (end._M_current == begin._M_current) goto LAB_0012c921;
  }
  else {
    lVar2 = 0;
    for (; local_60._M_impl.super__Vector_impl_data._M_start !=
           local_60._M_impl.super__Vector_impl_data._M_finish;
        local_60._M_impl.super__Vector_impl_data._M_start =
             local_60._M_impl.super__Vector_impl_data._M_start + 1) {
      lVar2 = lVar2 + *local_60._M_impl.super__Vector_impl_data._M_start;
    }
    if (lVar2 != 0) {
      assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0xe8,"distribute");
    }
    all2allv<int>(begin._M_current + (local_90 - local_88),
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,(int *)0x0,
                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,comm);
    if (local_90 - local_88 == 0) goto LAB_0012c921;
    __n = (local_90 - local_88) * 4;
  }
  memmove(__dest._M_current,begin._M_current,__n);
LAB_0012c921:
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if single process, copy input to output
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get sizes
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);
    typedef typename std::iterator_traits<_InIterator>::value_type T;

    if (mxx::any_of(local_size == total_size, comm)) {
        // use scatterv instead of all2all based communication
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // use surplus send-pairing to minimize total communication volume
        // TODO: use all2all or send/recv depending on the maximum number of
        //       paired processes

        // get surplus
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

        // allgather surpluses
        // TODO figure out how to do surplus send pairing without requiring allgather
        std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
        MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), (impl::signed_size_t)0) == 0);

        // get send counts
        std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

        if (surplus > 0) {
            MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), (size_t)0) == 0);
            // TODO: use iterators not pointers
            mxx::all2allv(&(*(begin+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
            std::copy(begin, begin+(local_size-surplus), out);
        } else {
            MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), (size_t)0) == 0);
            mxx::all2allv((const T*)nullptr, send_counts, &(*(out+local_size)), recv_counts, comm);
            std::copy(begin, end, out);
        }
    }
}